

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_test.c
# Opt level: O2

int main(void)

{
  int iVar1;
  uint uVar2;
  char *__s;
  undefined1 auVar3 [16];
  unsigned_long_long mlen;
  unsigned_long_long smlen;
  uchar message [50];
  uchar omessage [50];
  uchar pk [49];
  uchar sk [73];
  uchar sm [71233];
  
  auVar3 = ZEXT816(0) << 0x40;
  pk._32_17_ = ZEXT117(0);
  sk[0x40] = '\0';
  sk[0x41] = '\0';
  sk[0x42] = '\0';
  sk[0x43] = '\0';
  sk[0x44] = '\0';
  sk[0x45] = '\0';
  sk[0x46] = '\0';
  sk[0x47] = '\0';
  sk[0x48] = '\0';
  message[0x20] = '\0';
  message[0x21] = '\0';
  message[0x22] = '\0';
  message[0x23] = '\0';
  message[0x24] = '\0';
  message[0x25] = '\0';
  message[0x26] = '\0';
  message[0x27] = '\0';
  message[0x28] = '\0';
  message[0x29] = '\0';
  message[0x2a] = '\0';
  message[0x2b] = '\0';
  message[0x2c] = '\0';
  message[0x2d] = '\0';
  message[0x2e] = '\0';
  message[0x2f] = '\0';
  message[0x30] = '\0';
  message[0x31] = '\0';
  omessage._32_18_ = ZEXT218(0);
  pk[0x10] = '\0';
  pk[0] = auVar3[0];
  pk[1] = auVar3[1];
  pk[2] = auVar3[2];
  pk[3] = auVar3[3];
  pk[4] = auVar3[4];
  pk[5] = auVar3[5];
  pk[6] = auVar3[6];
  pk[7] = auVar3[7];
  pk[8] = auVar3[8];
  pk[9] = auVar3[9];
  pk[10] = auVar3[10];
  pk[0xb] = auVar3[0xb];
  pk[0xc] = auVar3[0xc];
  pk[0xd] = auVar3[0xd];
  pk[0xe] = auVar3[0xe];
  pk[0xf] = auVar3[0xf];
  pk[0x11] = '\0';
  pk[0x12] = '\0';
  pk[0x13] = '\0';
  pk[0x14] = '\0';
  pk[0x15] = '\0';
  pk[0x16] = '\0';
  pk[0x17] = '\0';
  pk[0x18] = '\0';
  pk[0x19] = '\0';
  pk[0x1a] = '\0';
  pk[0x1b] = '\0';
  pk[0x1c] = '\0';
  pk[0x1d] = '\0';
  pk[0x1e] = '\0';
  pk[0x1f] = '\0';
  sk[0] = '\0';
  sk[1] = '\0';
  sk[2] = '\0';
  sk[3] = '\0';
  sk[4] = '\0';
  sk[5] = '\0';
  sk[6] = '\0';
  sk[7] = '\0';
  sk[8] = '\0';
  sk[9] = '\0';
  sk[10] = '\0';
  sk[0xb] = '\0';
  sk[0xc] = '\0';
  sk[0xd] = '\0';
  sk[0xe] = '\0';
  sk[0xf] = '\0';
  sk[0x10] = '\0';
  sk[0x11] = '\0';
  sk[0x12] = '\0';
  sk[0x13] = '\0';
  sk[0x14] = '\0';
  sk[0x15] = '\0';
  sk[0x16] = '\0';
  sk[0x17] = '\0';
  sk[0x18] = '\0';
  sk[0x19] = '\0';
  sk[0x1a] = '\0';
  sk[0x1b] = '\0';
  sk[0x1c] = '\0';
  sk[0x1d] = '\0';
  sk[0x1e] = '\0';
  sk[0x1f] = '\0';
  sk[0x20] = '\0';
  sk[0x21] = '\0';
  sk[0x22] = '\0';
  sk[0x23] = '\0';
  sk[0x24] = '\0';
  sk[0x25] = '\0';
  sk[0x26] = '\0';
  sk[0x27] = '\0';
  sk[0x28] = '\0';
  sk[0x29] = '\0';
  sk[0x2a] = '\0';
  sk[0x2b] = '\0';
  sk[0x2c] = '\0';
  sk[0x2d] = '\0';
  sk[0x2e] = '\0';
  sk[0x2f] = '\0';
  sk[0x30] = '\0';
  sk[0x31] = '\0';
  sk[0x32] = '\0';
  sk[0x33] = '\0';
  sk[0x34] = '\0';
  sk[0x35] = '\0';
  sk[0x36] = '\0';
  sk[0x37] = '\0';
  sk[0x38] = '\0';
  sk[0x39] = '\0';
  sk[0x3a] = '\0';
  sk[0x3b] = '\0';
  sk[0x3c] = '\0';
  sk[0x3d] = '\0';
  sk[0x3e] = '\0';
  sk[0x3f] = '\0';
  message[0] = '\0';
  message[1] = '\0';
  message[2] = '\0';
  message[3] = '\0';
  message[4] = '\0';
  message[5] = '\0';
  message[6] = '\0';
  message[7] = '\0';
  message[8] = '\0';
  message[9] = '\0';
  message[10] = '\0';
  message[0xb] = '\0';
  message[0xc] = '\0';
  message[0xd] = '\0';
  message[0xe] = '\0';
  message[0xf] = '\0';
  message[0x10] = '\0';
  message[0x11] = '\0';
  message[0x12] = '\0';
  message[0x13] = '\0';
  message[0x14] = '\0';
  message[0x15] = '\0';
  message[0x16] = '\0';
  message[0x17] = '\0';
  message[0x18] = '\0';
  message[0x19] = '\0';
  message[0x1a] = '\0';
  message[0x1b] = '\0';
  message[0x1c] = '\0';
  message[0x1d] = '\0';
  message[0x1e] = '\0';
  message[0x1f] = '\0';
  omessage[0x10] = '\0';
  omessage[0x11] = '\0';
  omessage[0] = auVar3[0];
  omessage[1] = auVar3[1];
  omessage[2] = auVar3[2];
  omessage[3] = auVar3[3];
  omessage[4] = auVar3[4];
  omessage[5] = auVar3[5];
  omessage[6] = auVar3[6];
  omessage[7] = auVar3[7];
  omessage[8] = auVar3[8];
  omessage[9] = auVar3[9];
  omessage[10] = auVar3[10];
  omessage[0xb] = auVar3[0xb];
  omessage[0xc] = auVar3[0xc];
  omessage[0xd] = auVar3[0xd];
  omessage[0xe] = auVar3[0xe];
  omessage[0xf] = auVar3[0xf];
  omessage[0x12] = '\0';
  omessage[0x13] = '\0';
  omessage[0x14] = '\0';
  omessage[0x15] = '\0';
  omessage[0x16] = '\0';
  omessage[0x17] = '\0';
  omessage[0x18] = '\0';
  omessage[0x19] = '\0';
  omessage[0x1a] = '\0';
  omessage[0x1b] = '\0';
  omessage[0x1c] = '\0';
  omessage[0x1d] = '\0';
  omessage[0x1e] = '\0';
  omessage[0x1f] = '\0';
  memset(sm,0,0x11641);
  iVar1 = crypto_sign_keypair(pk,sk);
  if (iVar1 != 0) {
    __s = "Failed to generate key pair";
    goto LAB_001012b2;
  }
  smlen = 0x11641;
  iVar1 = crypto_sign(sm,&smlen,message,0x32,sk);
  if (iVar1 == 0) {
    mlen = 0x32;
    uVar2 = crypto_sign_open(omessage,&mlen,sm,smlen,pk);
    if (uVar2 != 0) {
LAB_001012f2:
      printf("Failed to verify (ret = %d)\n",(ulong)uVar2);
      return -1;
    }
    if (mlen != 0x32) {
LAB_001013dd:
      printf("length of message after verify incorrect, got %llu, expected %zu\n",mlen,0x32);
      return -1;
    }
    iVar1 = bcmp(message,omessage,0x32);
    if (iVar1 == 0) {
      smlen = 0x11641;
      iVar1 = crypto_sign(sm,&smlen,sm,0x32,sk);
      if (iVar1 != 0) goto LAB_001012ab;
      mlen = smlen;
      uVar2 = crypto_sign_open(sm,&mlen,sm,smlen,pk);
      if (uVar2 != 0) goto LAB_001012f2;
      if (mlen != 0x32) goto LAB_001013dd;
      iVar1 = bcmp(message,sm,0x32);
      if (iVar1 == 0) {
        puts("Sign/Verify test passed");
        return 0;
      }
    }
    __s = "message mismatch after verification";
  }
  else {
LAB_001012ab:
    __s = "Failed to sign";
  }
LAB_001012b2:
  puts(__s);
  return -1;
}

Assistant:

int main(void) {
  unsigned char pk[CRYPTO_PUBLICKEYBYTES]          = {0};
  unsigned char sk[CRYPTO_SECRETKEYBYTES]          = {0};
  const unsigned char message[50]                  = {0};
  unsigned char omessage[sizeof(message)]          = {0};
  unsigned char sm[sizeof(message) + CRYPTO_BYTES] = {0};

  int ret = crypto_sign_keypair(pk, sk);
  VALGRIND_MAKE_MEM_DEFINED(&ret, sizeof(ret));
  if (ret != 0) {
    printf("Failed to generate key pair\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_UNDEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_UNDEFINED(message, sizeof(message));

  unsigned long long smlen = sizeof(sm);
  ret                      = crypto_sign(sm, &smlen, message, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_DEFINED(sm, smlen);
  VALGRIND_MAKE_MEM_DEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_DEFINED(message, sizeof(message));

  unsigned long long mlen = sizeof(omessage);
  ret                     = crypto_sign_open(omessage, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, omessage, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  // test special case where message and signature overlap
  memcpy(sm, message, sizeof(message));

  smlen = sizeof(sm);
  ret   = crypto_sign(sm, &smlen, sm, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  mlen = smlen;
  ret  = crypto_sign_open(sm, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, sm, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  printf("Sign/Verify test passed\n");

  return 0;
}